

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O0

bool __thiscall
Corrade::Utility::ConfigurationGroup::removeGroup
          (ConfigurationGroup *this,ConfigurationGroup *group)

{
  ConfigurationGroup *this_00;
  bool bVar1;
  pointer pGVar2;
  EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U> local_44;
  Group *local_40;
  const_iterator local_38;
  __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
  local_30;
  __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
  local_28;
  iterator it;
  ConfigurationGroup *group_local;
  ConfigurationGroup *this_local;
  
  it._M_current = (Group *)group;
  local_28._M_current =
       (Group *)std::
                vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                ::begin(&this->_groups);
  while( true ) {
    local_30._M_current =
         (Group *)std::
                  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                  ::end(&this->_groups);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    pGVar2 = __gnu_cxx::
             __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
             ::operator->(&local_28);
    if (pGVar2->group == (ConfigurationGroup *)it._M_current) break;
    __gnu_cxx::
    __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
    ::operator++(&local_28);
  }
  pGVar2 = __gnu_cxx::
           __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
           ::operator->(&local_28);
  this_00 = pGVar2->group;
  if (this_00 != (ConfigurationGroup *)0x0) {
    ~ConfigurationGroup(this_00);
    operator_delete(this_00);
  }
  __gnu_cxx::
  __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_const*,std::vector<Corrade::Utility::ConfigurationGroup::Group,std::allocator<Corrade::Utility::ConfigurationGroup::Group>>>
  ::__normal_iterator<Corrade::Utility::ConfigurationGroup::Group*>
            ((__normal_iterator<Corrade::Utility::ConfigurationGroup::Group_const*,std::vector<Corrade::Utility::ConfigurationGroup::Group,std::allocator<Corrade::Utility::ConfigurationGroup::Group>>>
              *)&local_38,&local_28);
  local_40 = (Group *)std::
                      vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                      ::erase(&this->_groups,local_38);
  if (this->_configuration != (Configuration *)0x0) {
    Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
              (&local_44,Changed);
    Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::operator|=
              (&this->_configuration->_flags,local_44);
  }
  return true;
}

Assistant:

bool ConfigurationGroup::removeGroup(ConfigurationGroup* const group) {
    for(auto it = _groups.begin(); it != _groups.end(); ++it) {
        if(it->group == group) {
            delete it->group;
            _groups.erase(it);
            if(_configuration) _configuration->_flags |= Configuration::InternalFlag::Changed;
            return true;
        }
    }

    return false;
}